

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O0

void __thiscall
amrex::MFPCInterp::interp
          (MFPCInterp *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,IntVect *ng
          ,Geometry *param_8,Geometry *param_9,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_12,int param_13)

{
  bool bVar1;
  int iVar2;
  int in_EDX;
  int in_R8D;
  int in_R9D;
  IntVect *in_stack_00000008;
  int *in_stack_00000028;
  Box result;
  Box *fbox;
  Array4<const_double> *crse;
  Array4<double> *fine;
  MFIter mfi;
  int ic;
  int i;
  int jc;
  int j;
  int kc;
  int k;
  int n;
  Dim3 hi;
  Dim3 lo;
  int in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  int in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  int in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  int in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc74;
  int local_388;
  int local_384;
  int local_380;
  undefined4 in_stack_fffffffffffffc84;
  FabArrayBase *in_stack_fffffffffffffc88;
  long *plVar3;
  MFIter *in_stack_fffffffffffffc90;
  long *plVar4;
  undefined1 local_344 [28];
  Box local_328;
  int local_304;
  int local_300;
  int iStack_2fc;
  int iStack_2f8;
  int local_2f4;
  int iStack_2f0;
  int *local_2e8;
  long local_2e0 [8];
  long *local_2a0;
  long local_298 [8];
  long *local_258;
  MFIter local_250;
  int local_1f0;
  int local_1ec;
  int local_1dc;
  undefined1 *local_1c0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  int *local_158;
  int local_14c;
  long *local_148;
  int local_140;
  int local_13c;
  long *local_138;
  int *local_130;
  undefined4 local_124;
  undefined4 local_114;
  undefined4 local_104;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int *local_c0;
  undefined4 local_ac;
  int *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  int *local_88;
  int *local_70;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  long *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long *local_8;
  
  local_1f0 = in_R9D;
  local_1ec = in_R8D;
  local_1dc = in_EDX;
  MFIter::MFIter(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (uchar)((uint)in_stack_fffffffffffffc84 >> 0x18));
  while (bVar1 = MFIter::isValid(&local_250), bVar1) {
    plVar3 = local_298;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
               (MFIter *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    plVar4 = local_2e0;
    local_258 = plVar3;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
               (MFIter *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    local_2a0 = plVar4;
    MFIter::validbox((MFIter *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    local_1c0 = local_344;
    Box::grow(&local_328,in_stack_00000008);
    Box::operator&((Box *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   (Box *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    local_138 = local_258;
    local_13c = local_1ec;
    local_140 = local_1f0;
    local_148 = local_2a0;
    local_14c = local_1dc;
    local_158 = in_stack_00000028;
    local_8c = 0;
    local_9c = 1;
    local_ac = 2;
    local_38 = &iStack_2f8;
    local_3c = 0;
    local_48 = &iStack_2f8;
    local_4c = 1;
    local_58 = &iStack_2f8;
    local_5c = 2;
    for (local_19c = 0; iVar2 = iStack_2fc, local_19c < local_1f0; local_19c = local_19c + 1) {
      while (local_1a0 = iVar2, local_1a0 <= iStack_2f0) {
        local_d8 = local_1a0;
        local_104 = 2;
        local_dc = in_stack_00000028[2];
        if (local_dc == 1) {
          local_d4 = local_1a0;
        }
        else if (local_dc == 2) {
          if (local_1a0 < 0) {
            iVar2 = local_1a0 + 1;
            if (iVar2 < 1) {
              iVar2 = -iVar2;
            }
            local_380 = -iVar2 / 2 + -1;
          }
          else {
            local_380 = local_1a0 / 2;
          }
          local_d4 = local_380;
        }
        else if (local_dc == 4) {
          if (local_1a0 < 0) {
            iVar2 = local_1a0 + 1;
            if (iVar2 < 1) {
              iVar2 = -iVar2;
            }
            local_384 = -iVar2 / 4 + -1;
          }
          else {
            local_384 = local_1a0 / 4;
          }
          local_d4 = local_384;
        }
        else {
          if (local_1a0 < 0) {
            iVar2 = local_1a0 + 1;
            if (iVar2 < 1) {
              iVar2 = -iVar2;
            }
            local_388 = -iVar2 / local_dc + -1;
          }
          else {
            local_388 = local_1a0 / local_dc;
          }
          local_d4 = local_388;
        }
        local_1a4 = local_d4;
        for (local_1a8 = local_300; local_1a8 <= local_2f4; local_1a8 = local_1a8 + 1) {
          local_e4 = local_1a8;
          local_114 = 1;
          in_stack_fffffffffffffc74 = in_stack_00000028[1];
          if (in_stack_fffffffffffffc74 == 1) {
            local_e0 = local_1a8;
          }
          else if (in_stack_fffffffffffffc74 == 2) {
            if (local_1a8 < 0) {
              iVar2 = local_1a8 + 1;
              if (iVar2 < 1) {
                iVar2 = -iVar2;
              }
              in_stack_fffffffffffffc70 = -iVar2 / 2 + -1;
              local_e0 = in_stack_fffffffffffffc70;
            }
            else {
              in_stack_fffffffffffffc70 = local_1a8 / 2;
              local_e0 = in_stack_fffffffffffffc70;
            }
          }
          else if (in_stack_fffffffffffffc74 == 4) {
            if (local_1a8 < 0) {
              iVar2 = local_1a8 + 1;
              if (iVar2 < 1) {
                iVar2 = -iVar2;
              }
              in_stack_fffffffffffffc6c = -iVar2 / 4 + -1;
              local_e0 = in_stack_fffffffffffffc6c;
            }
            else {
              in_stack_fffffffffffffc6c = local_1a8 / 4;
              local_e0 = in_stack_fffffffffffffc6c;
            }
          }
          else if (local_1a8 < 0) {
            iVar2 = local_1a8 + 1;
            if (iVar2 < 1) {
              iVar2 = -iVar2;
            }
            in_stack_fffffffffffffc68 = -iVar2 / in_stack_fffffffffffffc74 + -1;
            local_e0 = in_stack_fffffffffffffc68;
          }
          else {
            in_stack_fffffffffffffc68 = local_1a8 / in_stack_fffffffffffffc74;
            local_e0 = in_stack_fffffffffffffc68;
          }
          local_1ac = local_e0;
          for (local_1b0 = local_304; local_1b0 <= iStack_2f8; local_1b0 = local_1b0 + 1) {
            local_f0 = local_1b0;
            local_124 = 0;
            in_stack_fffffffffffffc64 = *in_stack_00000028;
            if (in_stack_fffffffffffffc64 == 1) {
              local_ec = local_1b0;
            }
            else if (in_stack_fffffffffffffc64 == 2) {
              if (local_1b0 < 0) {
                iVar2 = local_1b0 + 1;
                if (iVar2 < 1) {
                  iVar2 = -iVar2;
                }
                in_stack_fffffffffffffc60 = -iVar2 / 2 + -1;
                local_ec = in_stack_fffffffffffffc60;
              }
              else {
                in_stack_fffffffffffffc60 = local_1b0 / 2;
                local_ec = in_stack_fffffffffffffc60;
              }
            }
            else if (in_stack_fffffffffffffc64 == 4) {
              if (local_1b0 < 0) {
                iVar2 = local_1b0 + 1;
                if (iVar2 < 1) {
                  iVar2 = -iVar2;
                }
                in_stack_fffffffffffffc5c = -iVar2 / 4 + -1;
                local_ec = in_stack_fffffffffffffc5c;
              }
              else {
                in_stack_fffffffffffffc5c = local_1b0 / 4;
                local_ec = in_stack_fffffffffffffc5c;
              }
            }
            else if (local_1b0 < 0) {
              iVar2 = local_1b0 + 1;
              if (iVar2 < 1) {
                iVar2 = -iVar2;
              }
              in_stack_fffffffffffffc58 = -iVar2 / in_stack_fffffffffffffc64 + -1;
              local_ec = in_stack_fffffffffffffc58;
            }
            else {
              in_stack_fffffffffffffc58 = local_1b0 / in_stack_fffffffffffffc64;
              local_ec = in_stack_fffffffffffffc58;
            }
            local_1b4 = local_ec;
            local_20 = local_2a0;
            local_24 = local_ec;
            local_28 = local_e0;
            local_2c = local_d4;
            local_30 = local_19c + local_1dc;
            local_8 = local_258;
            local_c = local_1b0;
            local_10 = local_1a8;
            local_14 = local_1a0;
            local_18 = local_19c + local_1ec;
            *(undefined8 *)
             (*local_258 +
             ((long)(local_1b0 - (int)local_258[4]) +
              (long)(local_1a8 - *(int *)((long)local_258 + 0x24)) * local_258[1] +
              (long)(local_1a0 - (int)local_258[5]) * local_258[2] + (long)local_18 * local_258[3])
             * 8) = *(undefined8 *)
                     (*local_2a0 +
                     ((long)(local_ec - (int)local_2a0[4]) +
                      (long)(local_e0 - *(int *)((long)local_2a0 + 0x24)) * local_2a0[1] +
                      (long)(local_d4 - (int)local_2a0[5]) * local_2a0[2] +
                     (long)local_30 * local_2a0[3]) * 8);
            local_f4 = in_stack_fffffffffffffc64;
          }
          local_e8 = in_stack_fffffffffffffc74;
        }
        iVar2 = local_1a0 + 1;
      }
    }
    local_2e8 = &local_304;
    local_130 = &local_304;
    local_c0 = &local_304;
    local_a8 = &local_304;
    local_98 = &local_304;
    local_88 = &local_304;
    local_70 = &local_304;
    MFIter::operator++(&local_250);
  }
  MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  return;
}

Assistant:

void
MFPCInterp::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                    IntVect const& ng, Geometry const&, Geometry const&,
                    Box const& dest_domain, IntVect const& ratio,
                    Vector<BCRec> const&, int)
{
    AMREX_ASSERT(crsemf.nGrowVect() == 0);

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& crse = crsemf.const_arrays();
        auto const& fine = finemf.arrays();
        ParallelFor(finemf, ng, nc,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            if (dest_domain.contains(i,j,k)) {
                AMREX_D_TERM(int ic = amrex::coarsen(i,ratio[0]);,
                             int jc = amrex::coarsen(j,ratio[1]);,
                             int kc = amrex::coarsen(k,ratio[2]);)
                AMREX_D_PICK(fine[box_no](i,0,0,n+fcomp) = crse[box_no](ic, 0, 0,n+ccomp);,
                             fine[box_no](i,j,0,n+fcomp) = crse[box_no](ic,jc, 0,n+ccomp);,
                             fine[box_no](i,j,k,n+fcomp) = crse[box_no](ic,jc,kc,n+ccomp);)
            }
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
            auto const& fine = finemf.array(mfi);
            auto const& crse = crsemf.const_array(mfi);
            Box const& fbox = amrex::grow(mfi.validbox(), ng) & dest_domain;
            pcinterp_interp(fbox, fine, fcomp, nc, crse, ccomp, ratio);
        }
    }
}